

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall argo::json::copy_json(json *this,json *other)

{
  pointer puVar1;
  
  if (this != other) {
    reset(this);
    this->m_type = other->m_type;
    std::__cxx11::string::_M_assign((string *)&this->m_raw_value);
    switch(this->m_type) {
    case object_e:
      copy_construct_object(this,&(other->m_value).u_object);
      return;
    case array_e:
      copy_construct_array(this,&(other->m_value).u_array);
      return;
    case boolean_e:
      (this->m_value).u_boolean = (other->m_value).u_boolean;
      break;
    case number_int_e:
      (this->m_value).u_number_int = (other->m_value).u_number_int;
      break;
    case number_double_e:
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (other->m_value).u_array.
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      break;
    case string_e:
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&this->m_value + 0x10);
      puVar1 = (other->m_value).u_array.
               super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&this->m_value,puVar1,
                 (long)&(puVar1->_M_t).
                        super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t +
                 (long)&(((other->m_value).u_array.
                          super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                        super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                        super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                        super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
      return;
    }
  }
  return;
}

Assistant:

void json::copy_json(const json &other)
{
    if (this == &other) return;

    reset();
    m_type = other.m_type;
    m_raw_value = other.m_raw_value;

    if (m_type == object_e)
    {
        copy_construct_object(other.m_value.u_object);
    }
    else if (m_type == array_e)
    {
        copy_construct_array(other.m_value.u_array);
    }
    else if (m_type == string_e)
    {
        construct_string(other.m_value.u_string);
    }
    else if (m_type == boolean_e)
    {
        m_value.u_boolean = other.m_value.u_boolean;
    }
    else if (m_type == number_int_e)
    {
        m_value.u_number_int = other.m_value.u_number_int;
    }
    else if (m_type == number_double_e)
    {
        m_value.u_number_double = other.m_value.u_number_double;
    }
}